

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::FileDescriptorTables::AddAliasUnderParent
          (FileDescriptorTables *this,void *parent,string *name,Symbol symbol)

{
  bool bVar1;
  undefined4 in_ECX;
  second_type *in_RSI;
  first_type *in_RDI;
  PointerStringPair by_parent_key;
  char *local_40;
  pair<const_void_*,_const_char_*> local_38;
  undefined4 in_stack_fffffffffffffff4;
  
  local_40 = (char *)std::__cxx11::string::c_str();
  std::pair<const_void_*,_const_char_*>::pair<const_void_*&,_const_char_*,_true>
            (&local_38,(void **)&stack0xffffffffffffffe0,&local_40);
  bVar1 = InsertIfNotPresent<std::unordered_map<std::pair<void_const*,char_const*>,google::protobuf::Symbol,google::protobuf::(anonymous_namespace)::PointerStringPairHash,google::protobuf::(anonymous_namespace)::PointerStringPairEqual,std::allocator<std::pair<std::pair<void_const*,char_const*>const,google::protobuf::Symbol>>>>
                    ((unordered_map<std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>_>_>
                      *)CONCAT44(in_stack_fffffffffffffff4,in_ECX),in_RDI,in_RSI);
  return bVar1;
}

Assistant:

bool FileDescriptorTables::AddAliasUnderParent(const void* parent,
                                               const std::string& name,
                                               Symbol symbol) {
  PointerStringPair by_parent_key(parent, name.c_str());
  return InsertIfNotPresent(&symbols_by_parent_, by_parent_key, symbol);
}